

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferBufferParameters.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureBufferBufferParameters::iterate(TextureBufferBufferParameters *this)

{
  GLboolean GVar1;
  GLboolean GVar2;
  GLboolean GVar3;
  GLboolean GVar4;
  GLboolean GVar5;
  GLboolean GVar6;
  GLboolean GVar7;
  GLboolean GVar8;
  GLboolean GVar9;
  GLboolean GVar10;
  GLboolean GVar11;
  GLboolean GVar12;
  GLboolean GVar13;
  GLboolean GVar14;
  GLboolean GVar15;
  GLboolean GVar16;
  GLboolean GVar17;
  GLboolean GVar18;
  GLboolean GVar19;
  GLboolean GVar20;
  GLboolean GVar21;
  GLboolean GVar22;
  GLboolean GVar23;
  GLboolean GVar24;
  GLboolean GVar25;
  int iVar26;
  deUint32 dVar27;
  undefined4 extraout_var;
  GLubyte *pGVar29;
  char *description;
  qpTestResult testResult;
  long lVar28;
  
  iVar26 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar28 = CONCAT44(extraout_var,iVar26);
  initTest(this);
  GVar1 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8764,0);
  GVar2 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8764,0);
  (**(code **)(lVar28 + 0x150))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x100,0,0x88e5);
  dVar27 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar27,"Could not initialize buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0xdb);
  GVar3 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8764,0x100);
  GVar4 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8764,0x100);
  GVar5 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8765,0x88e5);
  GVar6 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bc,0);
  GVar7 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0);
  GVar8 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0);
  GVar9 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0);
  GVar10 = queryBufferParameteri64v
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0);
  GVar11 = queryBufferPointerv(this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bd,
                               (GLvoid *)0x0);
  pGVar29 = (GLubyte *)
            (**(code **)(lVar28 + 0xd00))
                      ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,0x100,1);
  this->m_buffer_pointer = pGVar29;
  dVar27 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar27,"Could not map buffer object\'s data store to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0xfa);
  GVar12 = queryBufferParameteriv
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bc,1);
  GVar13 = queryBufferParameteriv
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0);
  GVar14 = queryBufferParameteri64v
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0);
  GVar15 = queryBufferParameteriv
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0x100);
  GVar16 = queryBufferParameteri64v
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0x100);
  GVar17 = queryBufferParameteriv
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x911f,1);
  GVar18 = queryBufferPointerv(this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bd,
                               this->m_buffer_pointer);
  this->m_buffer_pointer = (GLubyte *)0x0;
  (**(code **)(lVar28 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  dVar27 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar27,"Unmapping buffer failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x116);
  pGVar29 = (GLubyte *)
            (**(code **)(lVar28 + 0xd00))
                      ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x80,0x80,2);
  this->m_buffer_pointer = pGVar29;
  dVar27 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar27,"Could not map buffer object\'s data store to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x11b);
  GVar19 = queryBufferParameteriv
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bc,1);
  GVar20 = queryBufferParameteriv
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0x80);
  GVar21 = queryBufferParameteri64v
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0x80);
  GVar22 = queryBufferParameteriv
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0x80);
  GVar23 = queryBufferParameteri64v
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0x80);
  GVar24 = queryBufferParameteriv
                     (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x911f,2);
  GVar25 = queryBufferPointerv(this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bd,
                               this->m_buffer_pointer);
  this->m_buffer_pointer = (GLubyte *)0x0;
  (**(code **)(lVar28 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  dVar27 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar27,"Unmapping buffer failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x138);
  if ((((((((GVar25 == '\0') || (GVar17 == '\0')) || (GVar18 == '\0')) ||
         (((GVar19 == '\0' || (GVar20 == '\0')) ||
          ((GVar21 == '\0' || ((GVar22 == '\0' || (GVar23 == '\0')))))))) || (GVar24 == '\0')) ||
       (((((GVar9 == '\0' || (GVar10 == '\0')) || (GVar11 == '\0')) ||
         ((GVar12 == '\0' || (GVar13 == '\0')))) ||
        ((GVar14 == '\0' || ((GVar15 == '\0' || (GVar16 == '\0')))))))) ||
      ((GVar1 == '\0' || (((GVar2 == '\0' || (GVar3 == '\0')) || (GVar4 == '\0')))))) ||
     (((GVar5 == '\0' || (GVar6 == '\0')) || ((GVar7 == '\0' || (GVar8 == '\0')))))) {
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  else {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferBufferParameters::iterate(void)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialization */
	initTest();

	glw::GLboolean test_passed = true;

	/* Query GL_BUFFER_SIZE without buffer object's data store initialized */
	test_passed =
		queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_SIZE, 0 /* expected size */) && test_passed;
	test_passed =
		queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_SIZE, 0 /* expected size */) && test_passed;

	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_bo_size, DE_NULL, GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not initialize buffer object's data store!");

	/* Query GL_BUFFER_SIZE with buffer object's data store initialized */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_SIZE, m_bo_size /* expected size */) &&
				  test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_SIZE,
										   (glw::GLint64)m_bo_size /* expected size */) &&
				  test_passed;

	/* Query GL_BUFFER_USAGE */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_USAGE, GL_STATIC_READ) && test_passed;

	/* Query GL_BUFFER_MAP... pnames without buffer object's data store being mapped */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAPPED, GL_FALSE) && test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET, 0 /* expected offset */) &&
				  test_passed;
	test_passed =
		queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET, 0 /* expected offset */) &&
		test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH, 0 /* expected size */) &&
				  test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH, 0 /* expected size */) &&
				  test_passed;

	test_passed =
		queryBufferPointerv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_POINTER, (glw::GLvoid*)DE_NULL) && test_passed;

	/* Mapping whole buffer object's data store */
	m_buffer_pointer = (glw::GLubyte*)gl.mapBufferRange(m_glExtTokens.TEXTURE_BUFFER, 0, m_bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer object's data store to client's address space!");

	/* Query GL_BUFFER_MAP... pnames with buffer object's data store being mapped */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAPPED, GL_TRUE) && test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET, 0 /* expected offset */) &&
				  test_passed;
	test_passed =
		queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET, 0 /* expected offset */) &&
		test_passed;

	test_passed =
		queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH, m_bo_size /* expected size */) &&
		test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH,
										   (glw::GLint64)m_bo_size /* expected size */) &&
				  test_passed;

	test_passed =
		queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_ACCESS_FLAGS, GL_MAP_READ_BIT) && test_passed;

	test_passed =
		queryBufferPointerv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_POINTER, (glw::GLvoid*)m_buffer_pointer) &&
		test_passed;

	/* Unmapping buffer object's data store */
	m_buffer_pointer = DE_NULL;
	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Unmapping buffer failed");

	/* Mapping part of buffer object's data store */
	m_buffer_pointer = (glw::GLubyte*)gl.mapBufferRange(m_glExtTokens.TEXTURE_BUFFER, m_bo_size / 2 /* offset */,
														m_bo_size / 2 /* size */, GL_MAP_WRITE_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer object's data store to client's address space!");

	/* Query GL_BUFFER_MAP... pnames with buffer object's data store being mapped */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAPPED, GL_TRUE) && test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET,
										 (m_bo_size / 2) /* expected offset */) &&
				  test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET,
										   (glw::GLint64)(m_bo_size / 2) /* expected offset */) &&
				  test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH,
										 (m_bo_size / 2) /* expected size */) &&
				  test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH,
										   (glw::GLint64)(m_bo_size / 2) /* expected size */) &&
				  test_passed;

	test_passed =
		queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_ACCESS_FLAGS, GL_MAP_WRITE_BIT) && test_passed;

	test_passed =
		queryBufferPointerv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_POINTER, (glw::GLvoid*)m_buffer_pointer) &&
		test_passed;

	/* Unmapping buffer object's data store */
	m_buffer_pointer = DE_NULL;
	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Unmapping buffer failed");

	if (test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}